

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

expansion * __thiscall
GEO::expansion::assign_det_111_2x3
          (expansion *this,expansion *a21,expansion *a22,expansion *a23,expansion *a31,
          expansion *a32,expansion *a33)

{
  uint uVar1;
  undefined8 this_00;
  double a12;
  double a22_00;
  long lVar2;
  long lVar3;
  expansion *this_01;
  expansion *this_02;
  expansion *this_03;
  double dStack_50;
  expansion local_48;
  
  uVar1 = (a23->length_ * a32->length_ + a33->length_ * a22->length_) * 2;
  lVar2 = (ulong)uVar1 * 8 + 0x10;
  lVar3 = -lVar2;
  this_01 = (expansion *)((long)&local_48 + lVar3);
  local_48._0_8_ = this;
  local_48.x_[0] = (double)a22;
  local_48.x_[1] = (double)a32;
  *(undefined4 *)((long)&local_48 - lVar2) = 0;
  *(uint *)((long)&local_48 + lVar3 + 4) = uVar1;
  *(undefined8 *)((long)&dStack_50 + lVar3) = 0x14ec2f;
  assign_det2x2(this_01,a22,a23,a32,a33);
  uVar1 = (a21->length_ * a33->length_ + a31->length_ * a23->length_) * 2;
  lVar3 = (ulong)uVar1 * 8 + 0x10;
  this_03 = (expansion *)((long)this_01 - lVar3);
  *(undefined4 *)((long)this_01 - lVar3) = 0;
  this_03->capacity_ = uVar1;
  this_03[-1].x_[1] = 6.77492951581914e-318;
  assign_det2x2(this_03,a23,a21,a33,a31);
  a22_00 = local_48.x_[1];
  a12 = local_48.x_[0];
  uVar1 = (*(index_t *)local_48.x_[0] * a31->length_ + *(index_t *)local_48.x_[1] * a21->length_) *
          2;
  lVar3 = (ulong)uVar1 * 8 + 0x10;
  this_02 = (expansion *)((long)this_03 - lVar3);
  *(undefined4 *)((long)this_03 - lVar3) = 0;
  this_02->capacity_ = uVar1;
  this_02[-1].x_[1] = 6.77530500570998e-318;
  assign_det2x2(this_02,a21,(expansion *)a12,a31,(expansion *)a22_00);
  this_00 = local_48._0_8_;
  this_02[-1].x_[1] = 6.7754087594956e-318;
  assign_sum((expansion *)this_00,this_01,this_03,this_02);
  return (expansion *)this_00;
}

Assistant:

expansion& expansion::assign_det_111_2x3(
        const expansion& a21, const expansion& a22, const expansion& a23,
        const expansion& a31, const expansion& a32, const expansion& a33
    ) {
        const expansion& c11 = expansion_det2x2(a22, a23, a32, a33);
        const expansion& c12 = expansion_det2x2(a23, a21, a33, a31);
        const expansion& c13 = expansion_det2x2(a21, a22, a31, a32);
        return this->assign_sum(c11, c12, c13);
    }